

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void load256two64(uint16_t *out,uint64_t hi,uint64_t lo,int is_signed)

{
  long lVar1;
  uint16_t *puVar2;
  
  puVar2 = out;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    *puVar2 = (uint16_t)(lo >> ((byte)lVar1 & 0x3f));
    puVar2 = puVar2 + 1;
  }
  puVar2 = out + 4;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    *puVar2 = (uint16_t)(hi >> ((byte)lVar1 & 0x3f));
    puVar2 = puVar2 + 1;
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    out[lVar1 + 8] = -(ushort)((long)hi < 0 && is_signed != 0);
  }
  return;
}

Assistant:

static void load256two64(uint16_t* out, uint64_t hi, uint64_t lo, int is_signed) {
    int i;
    uint64_t sign = is_signed && (hi >> 63) ? UINT64_MAX : 0;
    for (i = 0; i < 4; ++i) {
        out[i] = lo >> (16 * i);
    }
    for (i = 4; i < 8; ++i) {
        out[i] = hi >> (16 * (i - 4));
    }
    for (i = 8; i < 16; ++i) {
        out[i] = sign;
    }
}